

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

bool __thiscall crnlib::dxt_image::unpack(dxt_image *this,image_u8 *img)

{
  uint uVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  bool bVar3;
  uint i;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint i_1;
  uint block_y;
  uchar *puVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  uint x;
  ulong uVar12;
  int iVar13;
  uint block_x;
  uint uVar14;
  ulong uVar15;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_7c;
  color_quad_u8 pixels [16];
  
  uVar1 = this->m_total_elements;
  if (uVar1 != 0) {
    local_7c.m_u32 = 0xff000000;
    image<crnlib::color_quad<unsigned_char,_int>_>::resize
              (img,this->m_width,this->m_height,0xffffffff,
               (color_quad<unsigned_char,_int> *)&local_7c.field_0);
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      pixels[lVar5].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0xff000000;
    }
    bVar9 = 1;
    iVar4 = 0;
    for (block_y = 0; block_y < this->m_blocks_y; block_y = block_y + 1) {
      uVar14 = img->m_height + block_y * -4;
      uVar15 = (ulong)uVar14;
      if (3 < uVar14) {
        uVar15 = 4;
      }
      iVar13 = 0;
      for (uVar14 = 0; uVar14 < this->m_blocks_x; uVar14 = uVar14 + 1) {
        bVar3 = get_block_pixels(this,uVar14,block_y,pixels);
        uVar6 = img->m_width + uVar14 * -4;
        uVar7 = (ulong)uVar6;
        if (3 < uVar6) {
          uVar7 = 4;
        }
        puVar8 = &pixels[0].field_0.field_0.a;
        iVar10 = iVar4;
        for (uVar11 = 0; uVar11 < uVar15; uVar11 = uVar11 + 1) {
          for (uVar12 = 0; uVar12 < uVar7; uVar12 = uVar12 + 1) {
            pcVar2 = img->m_pPixels;
            uVar6 = img->m_pitch * iVar10 + iVar13 + (int)uVar12;
            pcVar2[uVar6].field_0.field_0.r = puVar8[uVar12 * 4 + -3];
            pcVar2[uVar6].field_0.field_0.g = puVar8[uVar12 * 4 + -2];
            pcVar2[uVar6].field_0.field_0.b = puVar8[uVar12 * 4 + -1];
            pcVar2[uVar6].field_0.field_0.a = puVar8[uVar12 * 4];
          }
          iVar10 = iVar10 + 1;
          puVar8 = puVar8 + 0x10;
        }
        bVar9 = bVar9 & bVar3;
        iVar13 = iVar13 + 4;
      }
      iVar4 = iVar4 + 4;
    }
    if (bVar9 == 0) {
      console::error("dxt_image::unpack: One or more invalid blocks encountered!");
    }
    img->m_comp_flags = 8;
    uVar14 = 8;
    for (uVar15 = 0; uVar15 < this->m_num_elements_per_block; uVar15 = uVar15 + 1) {
      uVar6 = 1 << (this->m_element_component_index[uVar15] & 0x1fU);
      if (this->m_element_component_index[uVar15] < '\0') {
        uVar6 = 7;
      }
      uVar14 = uVar14 | uVar6;
      img->m_comp_flags = uVar14;
    }
    bVar3 = get_dxt_format_has_alpha(this->m_format);
    img->m_comp_flags = (img->m_comp_flags & 0xfffffff7) + (uint)bVar3 * 8;
  }
  return uVar1 != 0;
}

Assistant:

bool dxt_image::unpack(image_u8& img) const {
  if (!m_total_elements)
    return false;

  img.resize(m_width, m_height);

  color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];
  for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
    pixels[i].set(0, 0, 0, 255);

  bool all_blocks_valid = true;
  for (uint block_y = 0; block_y < m_blocks_y; block_y++) {
    const uint pixel_ofs_y = block_y * cDXTBlockSize;
    const uint limit_y = math::minimum<uint>(cDXTBlockSize, img.get_height() - pixel_ofs_y);

    for (uint block_x = 0; block_x < m_blocks_x; block_x++) {
      if (!get_block_pixels(block_x, block_y, pixels))
        all_blocks_valid = false;

      const uint pixel_ofs_x = block_x * cDXTBlockSize;

      const uint limit_x = math::minimum<uint>(cDXTBlockSize, img.get_width() - pixel_ofs_x);

      for (uint y = 0; y < limit_y; y++) {
        const uint iy = pixel_ofs_y + y;

        for (uint x = 0; x < limit_x; x++) {
          const uint ix = pixel_ofs_x + x;

          img(ix, iy) = pixels[x + (y << cDXTBlockShift)];
        }
      }
    }
  }

  if (!all_blocks_valid)
    console::error("dxt_image::unpack: One or more invalid blocks encountered!");

  img.reset_comp_flags();
  img.set_component_valid(0, false);
  img.set_component_valid(1, false);
  img.set_component_valid(2, false);
  for (uint i = 0; i < m_num_elements_per_block; i++) {
    if (m_element_component_index[i] < 0) {
      img.set_component_valid(0, true);
      img.set_component_valid(1, true);
      img.set_component_valid(2, true);
    } else
      img.set_component_valid(m_element_component_index[i], true);
  }

  img.set_component_valid(3, get_dxt_format_has_alpha(m_format));

  return true;
}